

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall huelang::Environment::Run(Environment *this)

{
  Word WVar1;
  Word preevalword;
  allocator<char> local_61;
  value_type local_60;
  string local_50;
  
  while (*(long *)&(this->executionStack).field_0x30 != *(long *)&(this->executionStack).field_0x10)
  {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"preeval",&local_61);
    WVar1 = DefinitionTable::TokToWord(&this->definitionTable,&local_50);
    local_60.minor = WVar1.minor;
    local_60.major = WVar1.major;
    std::__cxx11::string::~string((string *)&local_50);
    std::deque<huelang::Word,_std::allocator<huelang::Word>_>::push_back
              ((deque<huelang::Word,_std::allocator<huelang::Word>_> *)&this->executionStack,
               &local_60);
    Evaluate(this);
    Evaluate(this);
  }
  return;
}

Assistant:

void Environment::Run() {
        while (!executionStack.empty()) {
            Word preevalword = definitionTable.TokToWord(PREEVALWORD);
            executionStack.push(preevalword);
            Evaluate();
            Evaluate();
        }
    }